

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O1

void __thiscall
agge::tests::RendererTests::RendererPopulatesBitmapWithMaskDataAccordinglyToOffsetAndWindow
          (RendererTests *this)

{
  uint8_t reference1 [42];
  bitmap<unsigned_char,_1UL,_0UL> bitmap;
  renderer r;
  blender<unsigned_char,_unsigned_char> blender;
  mask_full<8UL> mask;
  cell cells14 [2];
  cell cells13 [2];
  cell cells12 [2];
  cell cells11 [2];
  rect_i window1;
  scanline_cells cells1 [4];
  undefined8 local_1d8;
  uchar auStack_1d0 [40];
  bitmap<unsigned_char,_1UL,_0UL> local_1a8;
  renderer local_188;
  string local_178;
  blender<unsigned_char,_unsigned_char> local_158;
  LocationInfo local_138;
  mask_full<8UL> local_110;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined1 local_b0 [8];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined1 local_90 [8];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined1 local_70 [8];
  rect_i local_68;
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> local_58;
  undefined8 *local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  undefined1 *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  
  local_58.second = (cell *)local_70;
  local_88._0_8_ = 0;
  local_88._8_8_ = 0x400000011;
  local_78 = 0xffffffef00000000;
  local_40 = local_90;
  local_a8 = 1;
  uStack_a0 = 0x5000000ab;
  local_98 = 0xffffff5500000000;
  local_30 = local_b0;
  local_c8 = 2;
  uStack_c0 = 0x6000000a0;
  local_b8 = 0xffffff6000000000;
  local_20 = local_d0;
  local_e8 = 3;
  uStack_e0 = 0x7000000c0;
  local_d8 = 0xffffff4000000000;
  local_58.first = (cell *)local_88;
  local_48 = &local_a8;
  local_38 = &local_c8;
  local_28 = &local_e8;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,4>
            ((mask<8ul> *)&local_110,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [4])
             &local_58,0);
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x2a);
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x2a;
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x21] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x22] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x23] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x24] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x25] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x26] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x27] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x28] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x29] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_1a8._width = 6;
  local_1a8._height = 6;
  local_158.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188._scanline_cache._buffer = (uint8_t *)0x0;
  local_188._scanline_cache._size = 0;
  local_68.x1 = 2;
  local_68.y1 = 1;
  local_68.x2 = 5;
  local_68.y2 = 3;
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  renderer::operator()
            (&local_188,&local_1a8,(vector_i)0x100000001,&local_68,&local_110,&local_158,
             (simple_alpha<unsigned_char,_8UL> *)&local_1d8);
  auStack_1d0[0x18] = '\0';
  auStack_1d0[0x19] = '\0';
  auStack_1d0[0x1a] = '\0';
  auStack_1d0[0x1b] = '\0';
  auStack_1d0[0x1c] = '\0';
  auStack_1d0[0x1d] = '\0';
  auStack_1d0[0x1e] = '\0';
  auStack_1d0[0x1f] = '\0';
  auStack_1d0[0x20] = '\0';
  auStack_1d0[0x21] = '\0';
  auStack_1d0[8] = '\0';
  auStack_1d0[9] = '\0';
  auStack_1d0[10] = '\0';
  auStack_1d0[0xb] = '\0';
  auStack_1d0[0xc] = '\0';
  auStack_1d0[0xd] = '\0';
  auStack_1d0[0xe] = '\0';
  auStack_1d0[0xf] = '\0';
  auStack_1d0[0x10] = '\0';
  auStack_1d0[0x11] = '\0';
  auStack_1d0[0x12] = '\0';
  auStack_1d0[0x13] = '\0';
  auStack_1d0[0x14] = '\0';
  auStack_1d0[0x15] = '\0';
  auStack_1d0[0x16] = '\0';
  auStack_1d0[0x17] = '\0';
  local_1d8._0_1_ = '\0';
  local_1d8._1_1_ = 0xab;
  local_1d8._2_1_ = 0xab;
  local_1d8._3_1_ = 0xab;
  local_1d8._4_1_ = '\0';
  local_1d8._5_1_ = '\0';
  local_1d8._6_1_ = '\0';
  local_1d8._7_1_ = '\0';
  auStack_1d0[0] = 0xa0;
  auStack_1d0[1] = 0xa0;
  auStack_1d0[2] = 0xa0;
  auStack_1d0[3] = '\0';
  auStack_1d0[4] = '\0';
  auStack_1d0[5] = '\0';
  auStack_1d0[6] = '\0';
  auStack_1d0[7] = '\0';
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_138,&local_178,0x4b2);
  ut::are_equal<unsigned_char,42ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [42])&local_1d8,&local_1a8.data,&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.filename._M_dataplus._M_p != &local_138.filename.field_2) {
    operator_delete(local_138.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if (local_188._scanline_cache._buffer != (uint8_t *)0x0) {
    operator_delete__(local_188._scanline_cache._buffer);
  }
  if (local_158.filling_log.
      super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.filling_log.
                    super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_110.super_mask<8UL>._cells.
      super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.super_mask<8UL>._cells.
                    super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

test( RendererPopulatesBitmapWithMaskDataAccordinglyToOffsetAndWindow )
			{
				// INIT
				const mocks::cell cells11[] = { { 0, 0, 0x11 }, { 4, 0, -0x11 }, };
				const mocks::cell cells12[] = { { 1, 0, 0xAB }, { 5, 0, -0xAB }, };
				const mocks::cell cells13[] = { { 2, 0, 0xA0 }, { 6, 0, -0xA0 }, };
				const mocks::cell cells14[] = { { 3, 0, 0xC0 }, { 7, 0, -0xC0 }, };
				const mocks::mask<8>::scanline_cells cells1[] = {
					make_pair(begin(cells11), end(cells11)),
					make_pair(begin(cells12), end(cells12)),
					make_pair(begin(cells13), end(cells13)),
					make_pair(begin(cells14), end(cells14)),
				};
				const mocks::mask_full<8> mask(cells1, 0);
				mocks::bitmap<uint8_t, 1> bitmap(6, 6);
				mocks::blender<uint8_t, uint8_t> blender;
				renderer r;

				// ACT
				rect_i window1 = { 2, 1, 5, 3 };
				r(bitmap, mkvector(1, 1), &window1, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint8_t reference1[] = {
					0x00, 0xAB, 0xAB, 0xAB, 0x00, 0x00, 0x00,
					0x00, 0xA0, 0xA0, 0xA0, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
				};

				assert_equal(reference1, bitmap.data);
			}